

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForStatement.cpp
# Opt level: O0

void __thiscall
ninx::parser::element::ForStatement::ForStatement
          (ForStatement *this,string *iterator_name,
          unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
          *range_expr,
          unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
          *body)

{
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  *body_local;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  *range_expr_local;
  string *iterator_name_local;
  ForStatement *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement).super_ASTElement._vptr_ASTElement =
       (_func_int **)&PTR__ForStatement_001c76e8;
  std::__cxx11::string::string((string *)&this->iterator_name,(string *)iterator_name);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::unique_ptr(&this->range_expr,range_expr);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::unique_ptr(&this->body,body);
  return;
}

Assistant:

ninx::parser::element::ForStatement::ForStatement(const std::string &iterator_name, std::unique_ptr<ninx::parser::element::Expression> range_expr,
                                                  std::unique_ptr<ninx::parser::element::Block> body)
        : iterator_name(iterator_name), range_expr(std::move(range_expr)), body(std::move(body)) {}